

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

LY_ERR yin_parse_feature(lysp_yin_ctx *ctx,lysp_feature **features)

{
  lysp_feature *plVar1;
  lysp_ext_instance *object;
  LY_ERR LVar2;
  long *plVar3;
  long lVar4;
  lysp_ext_instance **exts;
  yin_subelement subelems [5];
  yin_subelement local_a8;
  undefined4 local_90;
  long *local_88;
  undefined2 local_80;
  undefined4 local_78;
  long *local_70;
  undefined2 local_68;
  undefined4 local_60;
  long *local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  plVar1 = *features;
  if (plVar1 == (lysp_feature *)0x0) {
    plVar3 = (long *)malloc(0x48);
    if (plVar3 != (long *)0x0) {
      *plVar3 = 1;
      goto LAB_00188ede;
    }
  }
  else {
    lVar4 = *(long *)&plVar1[-1].flags + 1;
    *(long *)&plVar1[-1].flags = lVar4;
    plVar3 = (long *)realloc(&plVar1[-1].flags,lVar4 * 0x40 | 8);
    if (plVar3 != (long *)0x0) {
LAB_00188ede:
      *features = (lysp_feature *)(plVar3 + 1);
      lVar4 = *plVar3;
      plVar3[lVar4 * 8 + -1] = 0;
      (plVar3 + lVar4 * 8 + -1)[1] = 0;
      plVar3[lVar4 * 8 + -3] = 0;
      (plVar3 + lVar4 * 8 + -3)[1] = 0;
      plVar3[lVar4 * 8 + -5] = 0;
      (plVar3 + lVar4 * 8 + -5)[1] = 0;
      plVar3[lVar4 * 8 + -7] = 0;
      (plVar3 + lVar4 * 8 + -7)[1] = 0;
      LVar2 = lyxml_ctx_next(ctx->xmlctx);
      if (LVar2 != LY_SUCCESS) {
        return LVar2 + (LVar2 == LY_SUCCESS);
      }
      LVar2 = yin_parse_attribute(ctx,YIN_ARG_NAME,(char **)(plVar3 + lVar4 * 8 + -7),Y_IDENTIF_ARG,
                                  LY_STMT_FEATURE);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      local_58 = plVar3 + lVar4 * 8;
      local_a8.type = LY_STMT_DESCRIPTION;
      local_a8.dest = local_58 + -3;
      local_a8.flags = 2;
      local_90 = 0x130000;
      local_88 = local_58 + -6;
      local_80 = 0;
      local_78 = 0x270000;
      local_70 = local_58 + -2;
      local_68 = 2;
      local_60 = 0x2c0000;
      local_50 = 2;
      uStack_40 = 0;
      local_38 = 0;
      local_48 = 0xf0000;
      exts = (lysp_ext_instance **)(local_58 + -1);
      LVar2 = yin_parse_content(ctx,&local_a8,5,plVar3 + lVar4 * 8 + -7,LY_STMT_FEATURE,(char **)0x0
                                ,exts);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      object = *exts;
      if (object == (lysp_ext_instance *)0x0) {
        return LY_SUCCESS;
      }
      LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0);
      return LVar2;
    }
    *(long *)&(*features)[-1].flags = *(long *)&(*features)[-1].flags + -1;
  }
  ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_feature");
  return LY_EMEM;
}

Assistant:

static LY_ERR
yin_parse_feature(struct lysp_yin_ctx *ctx, struct lysp_feature **features)
{
    struct lysp_feature *feat;

    /* allocate new feature */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *features, feat, LY_EMEM);

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &feat->name, Y_IDENTIF_ARG, LY_STMT_FEATURE));

    /* parse content */
    struct yin_subelement subelems[] = {
        {LY_STMT_DESCRIPTION, &feat->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_IF_FEATURE, &feat->iffeatures, 0},
        {LY_STMT_REFERENCE, &feat->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_STATUS, &feat->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), feat, LY_STMT_FEATURE, NULL, &feat->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, feat->exts));

    return LY_SUCCESS;
}